

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cpp
# Opt level: O0

void __thiscall CRollingBloomFilter::reset(CRollingBloomFilter *this)

{
  uint uVar1;
  iterator __first;
  iterator __last;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  long in_FS_OFFSET;
  FastRandomContext *this_00;
  FastRandomContext *in_stack_ffffffffffffff48;
  FastRandomContext local_90;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_90;
  FastRandomContext::FastRandomContext(in_stack_ffffffffffffff48,SUB81((ulong)in_RDI >> 0x38,0));
  uVar1 = RandomMixin<FastRandomContext>::rand<unsigned_int>
                    (&this_00->super_RandomMixin<FastRandomContext>);
  *(uint *)&in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = uVar1;
  FastRandomContext::~FastRandomContext(this_00);
  *(undefined4 *)
   ((long)&(in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined4 *)
   &(in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = 1;
  __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_RDI);
  __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_RDI);
  std::
  fill<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__last._M_current,(int *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CRollingBloomFilter::reset()
{
    nTweak = FastRandomContext().rand<unsigned int>();
    nEntriesThisGeneration = 0;
    nGeneration = 1;
    std::fill(data.begin(), data.end(), 0);
}